

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OrientationError.cpp
# Opt level: O0

KString * __thiscall
KDIS::DATA_TYPE::OrientationError::GetAsString_abi_cxx11_
          (KString *__return_storage_ptr__,OrientationError *this)

{
  ostream *poVar1;
  KString local_210;
  KString local_1f0;
  KString local_1d0;
  stringstream local_1a0 [8];
  KStringStream ss;
  ostream local_190 [376];
  OrientationError *local_18;
  OrientationError *this_local;
  
  local_18 = this;
  this_local = (OrientationError *)__return_storage_ptr__;
  std::__cxx11::stringstream::stringstream(local_1a0);
  poVar1 = std::operator<<(local_190,"OrientationError:\n");
  poVar1 = std::operator<<(poVar1,"\tAzimuth Error:   ");
  KFIXED<short,(unsigned_char)8>::GetAsString_abi_cxx11_(&local_1d0,&this->m_AziErr);
  poVar1 = std::operator<<(poVar1,(string *)&local_1d0);
  poVar1 = std::operator<<(poVar1,"\tElevation Error: ");
  KFIXED<short,(unsigned_char)8>::GetAsString_abi_cxx11_(&local_1f0,&this->m_ElvErr);
  poVar1 = std::operator<<(poVar1,(string *)&local_1f0);
  poVar1 = std::operator<<(poVar1,"\tRotation Error : ");
  KFIXED<short,(unsigned_char)8>::GetAsString_abi_cxx11_(&local_210,&this->m_RotErr);
  std::operator<<(poVar1,(string *)&local_210);
  std::__cxx11::string::~string((string *)&local_210);
  std::__cxx11::string::~string((string *)&local_1f0);
  std::__cxx11::string::~string((string *)&local_1d0);
  std::__cxx11::stringstream::str();
  std::__cxx11::stringstream::~stringstream(local_1a0);
  return __return_storage_ptr__;
}

Assistant:

KString OrientationError::GetAsString() const
{
    KStringStream ss;

    ss << "OrientationError:\n"
       << "\tAzimuth Error:   " << m_AziErr.GetAsString()
       << "\tElevation Error: " << m_ElvErr.GetAsString()
       << "\tRotation Error : " << m_RotErr.GetAsString();

    return ss.str();
}